

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateShutdownCode
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  FileDescriptor *file;
  FieldDescriptor *field;
  FieldGenerator *pFVar3;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  io::Printer::Print(printer,"delete $classname$::default_instance_;\n","classname",
                     &this->classname_);
  file = Descriptor::file(this->descriptor_);
  bVar1 = HasDescriptorMethods(file);
  if (bVar1) {
    io::Printer::Print(printer,"delete $classname$_reflection_;\n","classname",&this->classname_);
  }
  for (local_1c = 0; iVar2 = Descriptor::field_count(this->descriptor_), local_1c < iVar2;
      local_1c = local_1c + 1) {
    field = Descriptor::field(this->descriptor_,local_1c);
    pFVar3 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar3->_vptr_FieldGenerator[0xc])(pFVar3,printer);
  }
  for (local_20 = 0; iVar2 = Descriptor::nested_type_count(this->descriptor_), local_20 < iVar2;
      local_20 = local_20 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
              ::operator[](&this->nested_generators_,(long)local_20);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                        (this_00);
    GenerateShutdownCode(this_01,printer);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateShutdownCode(io::Printer* printer) {
  printer->Print(
    "delete $classname$::default_instance_;\n",
    "classname", classname_);

  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "delete $classname$_reflection_;\n",
      "classname", classname_);
  }

  // Handle default instances of fields.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateShutdownCode(printer);
  }

  // Handle nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateShutdownCode(printer);
  }
}